

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O0

void duckdb::SetBitOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  reference result_00;
  reference c;
  reference b;
  anon_class_8_1_6971b95b in_RDX;
  DataChunk *in_RDI;
  idx_t in_stack_ffffffffffffffb8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  anon_class_8_1_6971b95b a;
  
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  c = vector<duckdb::Vector,_true>::operator[]
                ((vector<duckdb::Vector,_true> *)result_00,in_stack_ffffffffffffffb8);
  b = vector<duckdb::Vector,_true>::operator[]
                ((vector<duckdb::Vector,_true> *)result_00,in_stack_ffffffffffffffb8);
  a.result = in_RDX.result;
  DataChunk::size(in_RDI);
  TernaryExecutor::
  Execute<duckdb::string_t,int,int,duckdb::string_t,duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
            (a.result,b,c,result_00,in_stack_ffffffffffffffb8,in_RDX);
  return;
}

Assistant:

static void SetBitOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	TernaryExecutor::Execute<string_t, int32_t, int32_t, string_t>(
	    args.data[0], args.data[1], args.data[2], result, args.size(),
	    [&](string_t input, int32_t n, int32_t new_value) {
		    if (new_value != 0 && new_value != 1) {
			    throw InvalidInputException("The new bit must be 1 or 0");
		    }
		    if (n < 0 || (idx_t)n > Bit::BitLength(input) - 1) {
			    throw OutOfRangeException("bit index %s out of valid range (0..%s)", NumericHelper::ToString(n),
			                              NumericHelper::ToString(Bit::BitLength(input) - 1));
		    }
		    string_t target = StringVector::EmptyString(result, input.GetSize());
		    memcpy(target.GetDataWriteable(), input.GetData(), input.GetSize());
		    Bit::SetBit(target, UnsafeNumericCast<idx_t>(n), UnsafeNumericCast<idx_t>(new_value));
		    return target;
	    });
}